

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::CustomModel::MergeFrom(CustomModel *this,CustomModel *from)

{
  LogMessage *other;
  ulong uVar1;
  CustomModel *pCVar2;
  Arena *pAVar3;
  string *psVar4;
  LogFinisher local_85;
  uint32_t cached_has_bits;
  byte local_71;
  LogMessage local_70;
  CustomModel *local_38;
  CustomModel *from_local;
  CustomModel *this_local;
  CustomModel *local_20;
  string *local_18;
  CustomModel *local_10;
  
  local_71 = 0;
  local_38 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/CustomModel.pb.cc"
               ,0x2d3);
    local_71 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_70,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_85,other);
  }
  if ((local_71 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_70);
  }
  google::protobuf::internal::
  MapFieldLite<CoreML::Specification::CustomModel_ParametersEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  ::MergeFrom(&this->parameters_,&local_38->parameters_);
  _internal_classname_abi_cxx11_(local_38);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pCVar2 = (CustomModel *)_internal_classname_abi_cxx11_(local_38);
    this_local = pCVar2;
    local_20 = this;
    pAVar3 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set(&this->classname_,pCVar2,pAVar3);
  }
  _internal_description_abi_cxx11_(local_38);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    psVar4 = _internal_description_abi_cxx11_(local_38);
    local_18 = psVar4;
    local_10 = this;
    pAVar3 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set(&this->description_,psVar4,pAVar3);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_38->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void CustomModel::MergeFrom(const CustomModel& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CustomModel)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  parameters_.MergeFrom(from.parameters_);
  if (!from._internal_classname().empty()) {
    _internal_set_classname(from._internal_classname());
  }
  if (!from._internal_description().empty()) {
    _internal_set_description(from._internal_description());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}